

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

void __thiscall
SQCompilation::CodegenVisitor::visitIfStatement(CodegenVisitor *this,IfStatement *ifStmt)

{
  size_type sVar1;
  long lVar2;
  long n;
  SQInteger SVar3;
  ulong uVar4;
  SQFuncState *pSVar5;
  ulong pos;
  SQObject local_58;
  SQScope __oldscope__;
  
  addLineNumber(this,&ifStmt->super_Statement);
  __oldscope__.outers = (this->_scope).outers;
  __oldscope__.stacksize = (this->_scope).stacksize;
  pSVar5 = this->_fs;
  (this->_scope).outers = pSVar5->_outers;
  SVar3 = SQFuncState::GetStackSize(pSVar5);
  (this->_scope).stacksize = SVar3;
  local_58._unVal.pTable = (SQTable *)0x0;
  local_58._type = OT_NULL;
  local_58._flags = '\0';
  local_58._5_3_ = 0;
  sqvector<SQObjectPtr,_unsigned_int>::push_back(&this->_scopedconsts,(SQObjectPtr *)&local_58);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_58);
  visitForceGet(this,&ifStmt->_cond->super_Node);
  pSVar5 = this->_fs;
  SVar3 = SQFuncState::PopTarget(pSVar5);
  uVar4 = 0;
  SQFuncState::AddInstruction(pSVar5,_OP_JZ,SVar3,0,0,0);
  pos = (ulong)((this->_fs->_instructions)._size - 1);
  Node::visit<SQCompilation::CodegenVisitor>(&ifStmt->_thenB->super_Node,this);
  pSVar5 = this->_fs;
  sVar1 = (pSVar5->_instructions)._size;
  if (ifStmt->_elseB != (Statement *)0x0) {
    SQFuncState::AddInstruction(pSVar5,_OP_JMP,0,0,0,0);
    uVar4 = (ulong)((this->_fs->_instructions)._size - 1);
    Node::visit<SQCompilation::CodegenVisitor>(&ifStmt->_elseB->super_Node,this);
    SQFuncState::SetInstructionParam
              (this->_fs,uVar4,1,((this->_fs->_instructions)._size - 1) - uVar4);
    pSVar5 = this->_fs;
    uVar4 = (ulong)(ifStmt->_elseB != (Statement *)0x0);
  }
  SQFuncState::SetInstructionParam(pSVar5,pos,1,((sVar1 - 1) - pos) + uVar4);
  lVar2 = this->_fs->_outers;
  SVar3 = SQFuncState::GetStackSize(this->_fs);
  n = (this->_scope).stacksize;
  if (SVar3 != n) {
    SQFuncState::SetStackSize(this->_fs,n);
    if (lVar2 != this->_fs->_outers) {
      SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
    }
  }
  (this->_scope).outers = __oldscope__.outers;
  (this->_scope).stacksize = __oldscope__.stacksize;
  sqvector<SQObjectPtr,_unsigned_int>::pop_back(&this->_scopedconsts);
  return;
}

Assistant:

void CodegenVisitor::visitIfStatement(IfStatement *ifStmt) {
    addLineNumber(ifStmt);
    BEGIN_SCOPE();

    visitForceGet(ifStmt->condition());

    _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
    SQInteger jnepos = _fs->GetCurrentPos();

    ifStmt->thenBranch()->visit(this);

    SQInteger endifblock = _fs->GetCurrentPos();

    if (ifStmt->elseBranch()) {
        _fs->AddInstruction(_OP_JMP);
        SQInteger jmppos = _fs->GetCurrentPos();
        ifStmt->elseBranch()->visit(this);
        _fs->SetInstructionParam(jmppos, 1, _fs->GetCurrentPos() - jmppos);
    }

    _fs->SetInstructionParam(jnepos, 1, endifblock - jnepos + (ifStmt->elseBranch() ? 1 : 0));
    END_SCOPE();
}